

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O3

int add_line(backtrace_state *state,dwarf_data *ddata,uintptr_t pc,char *filename,int lineno,
            backtrace_error_callback error_callback,void *data,line_vector *vec)

{
  size_t sVar1;
  void *pvVar2;
  long *plVar3;
  
  sVar1 = vec->count;
  if ((((sVar1 == 0) ||
       (pvVar2 = (vec->vec).base, *(uintptr_t *)((long)pvVar2 + sVar1 * 0x18 + -0x18) != pc)) ||
      (plVar3 = (long *)((long)pvVar2 + sVar1 * 0x18), (char *)plVar3[-2] != filename)) ||
     ((int)plVar3[-1] != lineno)) {
    plVar3 = (long *)tcmalloc_backtrace_vector_grow(state,0x18,error_callback,data,&vec->vec);
    if (plVar3 != (long *)0x0) {
      *plVar3 = pc + (ddata->base_address).m;
      plVar3[1] = (long)filename;
      *(int *)(plVar3 + 2) = lineno;
      sVar1 = vec->count;
      *(int *)((long)plVar3 + 0x14) = (int)sVar1;
      vec->count = sVar1 + 1;
    }
  }
  return (int)plVar3;
}

Assistant:

static int
add_line (struct backtrace_state *state, struct dwarf_data *ddata,
	  uintptr_t pc, const char *filename, int lineno,
	  backtrace_error_callback error_callback, void *data,
	  struct line_vector *vec)
{
  struct line *ln;

  /* If we are adding the same mapping, ignore it.  This can happen
     when using discriminators.  */
  if (vec->count > 0)
    {
      ln = (struct line *) vec->vec.base + (vec->count - 1);
      if (pc == ln->pc && filename == ln->filename && lineno == ln->lineno)
	return 1;
    }

  ln = ((struct line *)
	backtrace_vector_grow (state, sizeof (struct line), error_callback,
			       data, &vec->vec));
  if (ln == NULL)
    return 0;

  /* Add in the base address here, so that we can look up the PC
     directly.  */
  ln->pc = libbacktrace_add_base (pc, ddata->base_address);

  ln->filename = filename;
  ln->lineno = lineno;
  ln->idx = vec->count;

  ++vec->count;

  return 1;
}